

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Utf8CheckMode google::protobuf::internal::cpp::GetUtf8CheckMode(FieldDescriptor *field,bool is_lite)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  bool is_lite_local;
  FieldDescriptor *field_local;
  
  TVar2 = FieldDescriptor::type(field);
  if (TVar2 != TYPE_STRING) {
    bVar1 = FieldDescriptor::is_map(field);
    if (!bVar1) {
      return kNone;
    }
    pDVar3 = FieldDescriptor::message_type(field);
    pFVar4 = Descriptor::map_key(pDVar3);
    TVar2 = FieldDescriptor::type(pFVar4);
    if (TVar2 != TYPE_STRING) {
      pDVar3 = FieldDescriptor::message_type(field);
      pFVar4 = Descriptor::map_value(pDVar3);
      TVar2 = FieldDescriptor::type(pFVar4);
      if (TVar2 != TYPE_STRING) {
        return kNone;
      }
    }
  }
  bVar1 = IsStrictUtf8(field);
  if (!bVar1) {
    bVar1 = IsVerifyUtf8(field,is_lite);
    if (!bVar1) {
      return kNone;
    }
    return kVerify;
  }
  return kStrict;
}

Assistant:

Utf8CheckMode GetUtf8CheckMode(const FieldDescriptor* field, bool is_lite) {
  if (field->type() == FieldDescriptor::TYPE_STRING ||
      (field->is_map() && (field->message_type()->map_key()->type() ==
                               FieldDescriptor::TYPE_STRING ||
                           field->message_type()->map_value()->type() ==
                               FieldDescriptor::TYPE_STRING))) {
    if (IsStrictUtf8(field)) {
      return Utf8CheckMode::kStrict;
    } else if (IsVerifyUtf8(field, is_lite)) {
      return Utf8CheckMode::kVerify;
    }
  }
  return Utf8CheckMode::kNone;
}